

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression_suite.cpp
# Opt level: O0

void double_suite::test_scatter(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  double absolute_tolerance;
  double *in_stack_fffffffffffffca8;
  double local_348;
  value_type local_340;
  size_type local_338;
  double local_328;
  value_type local_320;
  size_type local_318;
  double local_308;
  value_type local_300;
  size_type local_2f8;
  double local_2e8;
  value_type local_2e0;
  size_type local_2d8;
  double local_2c8;
  value_type local_2c0;
  size_type local_2b8;
  double local_2a8;
  value_type local_2a0;
  size_type local_298;
  double local_288;
  value_type local_280;
  size_type local_278;
  double local_268;
  value_type local_260;
  size_type local_258;
  double local_248;
  value_type local_240;
  size_type local_238;
  double local_228;
  value_type local_220;
  size_type local_218;
  double local_208;
  value_type local_200;
  size_type local_1f8;
  double local_1e8;
  value_type local_1e0;
  size_type local_1d8;
  double local_1c8;
  value_type local_1c0;
  size_type local_1b8;
  double local_1a8;
  value_type local_1a0;
  size_type local_198;
  double local_188;
  value_type local_180;
  size_type local_178;
  double local_168;
  value_type local_160;
  size_type local_158;
  double local_148;
  value_type local_140;
  size_type local_138;
  double local_128;
  value_type local_120;
  size_type local_118;
  double local_108;
  value_type local_100;
  size_type local_f8;
  double local_e8;
  value_type local_e0;
  size_type local_d8;
  double local_c8;
  value_type local_c0;
  undefined1 local_b8 [8];
  regression<double,_4UL> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)
             &filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count,1e-05,absolute_tolerance);
  trial::online::interim::regression<double,_4UL>::regression((regression<double,_4UL> *)local_b8);
  trial::online::interim::regression<double,_4UL>::push((regression<double,_4UL> *)local_b8,1.0,1.0)
  ;
  local_c0 = trial::online::interim::regression<double,_4UL>::slope
                       ((regression<double,_4UL> *)local_b8);
  local_c8 = 0.0;
  local_d8 = filter.y_moment.
             super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.passive
             .member.count;
  predicate_19.absolute = tolerance.relative;
  predicate_19.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x17e,0x10c9bd,(char *)&local_c0,&local_c8,in_stack_fffffffffffffca8,
             predicate_19);
  local_e0 = trial::online::interim::regression<double,_4UL>::at
                       ((regression<double,_4UL> *)local_b8,0.0);
  local_e8 = 1.0;
  local_f8 = filter.y_moment.
             super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.passive
             .member.count;
  predicate_18.absolute = tolerance.relative;
  predicate_18.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0.0)","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x17f,0x10c9bd,(char *)&local_e0,&local_e8,in_stack_fffffffffffffca8,
             predicate_18);
  local_100 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,1.0);
  local_108 = 1.0;
  local_118 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_17.absolute = tolerance.relative;
  predicate_17.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(1.0)","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x180,0x10c9bd,(char *)&local_100,&local_108,in_stack_fffffffffffffca8,
             predicate_17);
  trial::online::interim::regression<double,_4UL>::push((regression<double,_4UL> *)local_b8,2.0,2.0)
  ;
  local_120 = trial::online::interim::regression<double,_4UL>::slope
                        ((regression<double,_4UL> *)local_b8);
  local_128 = 1.0;
  local_138 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_16.absolute = tolerance.relative;
  predicate_16.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x183,0x10c9bd,(char *)&local_120,&local_128,in_stack_fffffffffffffca8,
             predicate_16);
  local_140 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,0.0);
  local_148 = 0.0;
  local_158 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_15.absolute = tolerance.relative;
  predicate_15.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0.0)","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x184,0x10c9bd,(char *)&local_140,&local_148,in_stack_fffffffffffffca8,
             predicate_15);
  local_160 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,2.0);
  local_168 = 2.0;
  local_178 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_14.absolute = tolerance.relative;
  predicate_14.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(2.0)","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x185,0x10c9bd,(char *)&local_160,&local_168,in_stack_fffffffffffffca8,
             predicate_14);
  trial::online::interim::regression<double,_4UL>::push((regression<double,_4UL> *)local_b8,3.0,1.3)
  ;
  local_180 = trial::online::interim::regression<double,_4UL>::slope
                        ((regression<double,_4UL> *)local_b8);
  local_188 = 0.15;
  local_198 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_13.absolute = tolerance.relative;
  predicate_13.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.15","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x188,0x10c9bd,(char *)&local_180,&local_188,in_stack_fffffffffffffca8,
             predicate_13);
  local_1a0 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,0.0);
  local_1a8 = 1.13333;
  local_1b8 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_12.absolute = tolerance.relative;
  predicate_12.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0.0)","1.13333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x189,0x10c9bd,(char *)&local_1a0,&local_1a8,in_stack_fffffffffffffca8,
             predicate_12);
  local_1c0 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,3.0);
  local_1c8 = 1.58333;
  local_1d8 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_11.absolute = tolerance.relative;
  predicate_11.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(3.0)","1.58333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x18a,0x10c9bd,(char *)&local_1c0,&local_1c8,in_stack_fffffffffffffca8,
             predicate_11);
  trial::online::interim::regression<double,_4UL>::push
            ((regression<double,_4UL> *)local_b8,4.0,3.75);
  local_1e0 = trial::online::interim::regression<double,_4UL>::slope
                        ((regression<double,_4UL> *)local_b8);
  local_1e8 = 0.755;
  local_1f8 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.755","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x18d,0x10c9bd,(char *)&local_1e0,&local_1e8,in_stack_fffffffffffffca8,
             predicate_10);
  local_200 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,0.0);
  local_208 = 0.125;
  local_218 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0.0)","0.125","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x18e,0x10c9bd,(char *)&local_200,&local_208,in_stack_fffffffffffffca8,
             predicate_09);
  local_220 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,4.0);
  local_228 = 3.145;
  local_238 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(4.0)","3.145","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x18f,0x10c9bd,(char *)&local_220,&local_228,in_stack_fffffffffffffca8,
             predicate_08);
  trial::online::interim::regression<double,_4UL>::push
            ((regression<double,_4UL> *)local_b8,5.0,2.25);
  local_240 = trial::online::interim::regression<double,_4UL>::slope
                        ((regression<double,_4UL> *)local_b8);
  local_248 = 0.755;
  local_258 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.755","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x194,0x10c9bd,(char *)&local_240,&local_248,in_stack_fffffffffffffca8,
             predicate_07);
  local_260 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,0.0);
  local_268 = -0.535;
  local_278 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0.0)","-0.535","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x195,0x10c9bd,(char *)&local_260,&local_268,in_stack_fffffffffffffca8,
             predicate_06);
  local_280 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,5.0);
  local_288 = 3.24;
  local_298 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(5.0)","3.24","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x196,0x10c9bd,(char *)&local_280,&local_288,in_stack_fffffffffffffca8,
             predicate_05);
  trial::online::interim::regression<double,_4UL>::push((regression<double,_4UL> *)local_b8,6.0,4.5)
  ;
  local_2a0 = trial::online::interim::regression<double,_4UL>::slope
                        ((regression<double,_4UL> *)local_b8);
  local_2a8 = 0.818617;
  local_2b8 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.818617","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x199,0x10c9bd,(char *)&local_2a0,&local_2a8,in_stack_fffffffffffffca8,
             predicate_04);
  local_2c0 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,0.0);
  local_2c8 = -0.762943;
  local_2d8 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0.0)","-0.762943","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x19a,0x10c9bd,(char *)&local_2c0,&local_2c8,in_stack_fffffffffffffca8,
             predicate_03);
  local_2e0 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,6.0);
  local_2e8 = 4.14876;
  local_2f8 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(6.0)","4.14876","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x19b,0x10c9bd,(char *)&local_2e0,&local_2e8,in_stack_fffffffffffffca8,
             predicate_02);
  trial::online::interim::regression<double,_4UL>::push((regression<double,_4UL> *)local_b8,7.0,4.5)
  ;
  local_300 = trial::online::interim::regression<double,_4UL>::slope
                        ((regression<double,_4UL> *)local_b8);
  local_308 = 0.883696;
  local_318 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.883696","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x19e,0x10c9bd,(char *)&local_300,&local_308,in_stack_fffffffffffffca8,
             predicate_01);
  local_320 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,0.0);
  local_328 = -1.35854;
  local_338 = filter.y_moment.
              super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
              passive.member.count;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","-1.35854","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x19f,0x10c9bd,(char *)&local_320,&local_328,in_stack_fffffffffffffca8,
             predicate_00);
  local_340 = trial::online::interim::regression<double,_4UL>::at
                        ((regression<double,_4UL> *)local_b8,7.0);
  local_348 = 4.82733;
  predicate.absolute = tolerance.relative;
  predicate.relative =
       (double)filter.y_moment.
               super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.
               passive.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(7.0)","4.82733","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/regression_suite.cpp"
             ,(char *)0x1a0,0x10c9bd,(char *)&local_340,&local_348,
             (double *)
             filter.y_moment.
             super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>.passive
             .member.count,predicate);
  return;
}

Assistant:

void test_scatter()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    interim::regression<double, 4> filter;

    filter.push(1.0, 1.0);
    TRIAL_TEST_WITH(filter.slope(), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0.0), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.at(1.0), 1.0, tolerance);

    filter.push(2.0, 2.0);
    TRIAL_TEST_WITH(filter.slope(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.at(0.0), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.at(2.0), 2.0, tolerance);

    filter.push(3.0, 1.3);
    TRIAL_TEST_WITH(filter.slope(), 0.15, tolerance);
    TRIAL_TEST_WITH(filter.at(0.0), 1.13333, tolerance);
    TRIAL_TEST_WITH(filter.at(3.0), 1.58333, tolerance);

    filter.push(4.0, 3.75);
    TRIAL_TEST_WITH(filter.slope(), 0.755, tolerance);
    TRIAL_TEST_WITH(filter.at(0.0), 0.125, tolerance);
    TRIAL_TEST_WITH(filter.at(4.0), 3.145, tolerance);

    // Window full

    filter.push(5.0, 2.25);
    TRIAL_TEST_WITH(filter.slope(), 0.755, tolerance);
    TRIAL_TEST_WITH(filter.at(0.0), -0.535, tolerance);
    TRIAL_TEST_WITH(filter.at(5.0), 3.24, tolerance);

    filter.push(6.0, 4.5);
    TRIAL_TEST_WITH(filter.slope(), 0.818617, tolerance);
    TRIAL_TEST_WITH(filter.at(0.0), -0.762943, tolerance);
    TRIAL_TEST_WITH(filter.at(6.0), 4.14876, tolerance);

    filter.push(7.0, 4.5);
    TRIAL_TEST_WITH(filter.slope(), 0.883696, tolerance);
    TRIAL_TEST_WITH(filter.at(0), -1.35854, tolerance);
    TRIAL_TEST_WITH(filter.at(7.0), 4.82733, tolerance);
}